

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(BaseSocket_*,_void_*)> * __thiscall
BaseSocket::BindCloseFunction
          (function<void_(BaseSocket_*,_void_*)> *__return_storage_ptr__,BaseSocket *this,
          function<void_(BaseSocket_*,_void_*)> *fClosing)

{
  BaseSocketImpl *pBVar1;
  function<void_(BaseSocket_*,_void_*)> local_40;
  function<void_(BaseSocket_*,_void_*)> *local_20;
  function<void_(BaseSocket_*,_void_*)> *fClosing_local;
  BaseSocket *this_local;
  
  local_20 = fClosing;
  fClosing_local = (function<void_(BaseSocket_*,_void_*)> *)this;
  this_local = (BaseSocket *)__return_storage_ptr__;
  pBVar1 = GetImpl(this);
  std::function<void_(BaseSocket_*,_void_*)>::function(&local_40,fClosing);
  (*pBVar1->_vptr_BaseSocketImpl[6])(__return_storage_ptr__,pBVar1,&local_40);
  std::function<void_(BaseSocket_*,_void_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(BaseSocket*, void*)> BaseSocket::BindCloseFunction(std::function<void(BaseSocket*, void*)> fClosing)
{
    return GetImpl()->BindCloseFunction(fClosing);
}